

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O3

string * __thiscall
dpfb::unicode::utf16ToUtf8_abi_cxx11_
          (string *__return_storage_ptr__,unicode *this,char16_t *begin,char16_t *end)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  byte bVar4;
  uint uVar5;
  byte *pbVar6;
  unicode *puVar7;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this < begin) {
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    lVar3 = 0;
    do {
      puVar7 = this + 2;
      uVar5 = (uint)(ushort)*(char16_t *)this;
      if (puVar7 < begin && (uVar5 & 0xfc00) == 0xd800) {
        puVar7 = this + 4;
        if (((ushort)*(char16_t *)(this + 2) & 0xfc00) == 0xdc00) {
          uVar5 = (uVar5 & 0x3ff) * 0x400 + ((ushort)*(char16_t *)(this + 2) & 0x3ff) + 0x10000;
        }
LAB_0011d1d0:
        if ((uVar5 & 0x1ff800) == 0xd800) {
          iVar2 = (int)replacementCharacterUtf8_abi_cxx11_._8_8_;
        }
        else {
          iVar2 = 4 - (uint)(uVar5 < 0x10000);
        }
        bVar1 = false;
      }
      else if ((ushort)*(char16_t *)this < 0x80) {
        iVar2 = 1;
        bVar1 = true;
      }
      else {
        if (0x7ff < uVar5) goto LAB_0011d1d0;
        iVar2 = 2;
        bVar1 = false;
      }
      std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)(iVar2 + lVar3));
      pbVar6 = (byte *)((__return_storage_ptr__->_M_dataplus)._M_p + lVar3);
      bVar4 = (byte)uVar5;
      if (bVar1) {
        *pbVar6 = bVar4;
      }
      else if (uVar5 < 0x800) {
        *pbVar6 = (byte)(uVar5 >> 6) | 0xc0;
        pbVar6[1] = bVar4 & 0x3f | 0x80;
      }
      else if ((uVar5 & 0x1ff800) == 0xd800) {
        std::__cxx11::string::copy
                  (replacementCharacterUtf8_abi_cxx11_,(ulong)pbVar6,
                   replacementCharacterUtf8_abi_cxx11_._8_8_);
      }
      else if (uVar5 < 0x10000) {
        *pbVar6 = (byte)(uVar5 >> 0xc) | 0xe0;
        pbVar6[1] = (byte)(uVar5 >> 6) & 0x3f | 0x80;
        pbVar6[2] = bVar4 & 0x3f | 0x80;
      }
      else {
        *pbVar6 = (byte)(uVar5 >> 0x12) | 0xf0;
        pbVar6[1] = (byte)(uVar5 >> 0xc) & 0x3f | 0x80;
        pbVar6[2] = (byte)(uVar5 >> 6) & 0x3f | 0x80;
        pbVar6[3] = bVar4 & 0x3f | 0x80;
      }
      lVar3 = iVar2 + lVar3;
      this = puVar7;
    } while (puVar7 < begin);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string utf16ToUtf8(const char16_t* begin, const char16_t* end)
{
    std::string result;
    std::size_t resultLen = 0;

    if (begin < end)
        result.reserve(end - begin);

    while (begin < end) {
        char32_t cp = *begin++;
        // A lone surrogate is handled by utf8Length() and
        // encodeUtf8(), so we don't have to set cp to replacement
        // character.
        if (isLeadingSurrogate(cp) && begin < end) {
            const char32_t cp2 = *begin++;
            if (isTrailingSurrogate(cp2))
                cp = combineSurrogates(cp, cp2);
        }

        const auto seqIdx = resultLen;
        resultLen += utf8Length(cp);
        result.resize(resultLen);
        encodeUtf8(cp, &result[seqIdx]);
    }

    return result;
}